

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 6;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x13480f;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234x",7);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x134859;
  bVar1 = AString_replaceRange(&string,5,0x29a,'y',2);
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_replaceRange(&string, 5, 666, \'y\', 2)\' failed";
    iVar2 = 0x570;
LAB_00134b89:
    uStack_50 = 0x134b95;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x134872;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x570);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    iVar2 = 0x571;
    pcVar4 = (char *)string.capacity;
LAB_00134c90:
    local_58 = (char *)0x8;
LAB_00134c96:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
    goto LAB_00134c98;
  }
  uStack_50 = 0x134892;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x571);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x571;
    goto LAB_00134ce3;
  }
  uStack_50 = 0x1348af;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x571);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_00134ab8:
    local_60 = "01234yy";
    pcStack_70 = "(string).buffer == (\"01234yy\")";
    pcVar5 = "(string).buffer == (\"01234yy\")";
    iVar2 = 0x571;
  }
  else {
    uStack_50 = 0x1348cc;
    iVar2 = strcmp("01234yy",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_00134ab8;
    }
    uStack_50 = 0x1348e5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x571);
    if (string.size != 7) {
      local_60 = "strlen(\"01234yy\")";
      pcVar5 = "(string).size == strlen(\"01234yy\")";
      pcVar8 = "(string).size";
      iVar2 = 0x571;
      local_58 = (char *)0x7;
      pcVar4 = (char *)string.size;
      goto LAB_00134c96;
    }
    uStack_50 = 0x134905;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x571);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x572;
LAB_00134ce3:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_bufferExpanded_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x134926;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x572);
    uStack_50 = 0x134943;
    bVar1 = AString_replaceRange(&string,6,0x2a,'z',2);
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_replaceRange(&string, 6, 42, \'z\', 2)\' failed";
      iVar2 = 0x573;
      goto LAB_00134b89;
    }
    uStack_50 = 0x13495c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x573);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      pcVar4 = (char *)string.capacity;
LAB_00134c8b:
      iVar2 = 0x574;
      goto LAB_00134c90;
    }
    uStack_50 = 0x13497c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x574);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x574;
      goto LAB_00134ce3;
    }
    uStack_50 = 0x134999;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x574);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar4 = "";
    }
    else {
      uStack_50 = 0x1349b6;
      iVar2 = strcmp("01234yzz",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x1349cf;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x574);
        if (string.size == 8) {
          uStack_50 = 0x1349ef;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x574);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x134a10;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x575);
            uStack_50 = 0x134a19;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x575;
          goto LAB_00134ce3;
        }
        local_60 = "strlen(\"01234yzz\")";
        pcVar5 = "(string).size == strlen(\"01234yzz\")";
        pcVar8 = "(string).size";
        pcVar4 = (char *)string.size;
        goto LAB_00134c8b;
      }
      pcVar4 = "\"";
    }
    local_60 = "01234yzz";
    pcStack_70 = "(string).buffer == (\"01234yzz\")";
    pcVar5 = "(string).buffer == (\"01234yzz\")";
    iVar2 = 0x574;
  }
  pcStack_70 = pcStack_70 + 0x13;
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_00134c98:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x134c9f;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRange_success_indexInBoundsRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234x", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 5, 666, 'y', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yy", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 6, 42, 'z', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yzz", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}